

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraph.cpp
# Opt level: O3

void __thiscall
ControlFlowGraph::ControlFlowGraph(ControlFlowGraph *this,DGLLVMPointerAnalysis *pointsToAnalysis)

{
  _Head_base<0UL,_GraphBuilder_*,_false> this_00;
  ThreadRegionsBuilder *this_01;
  CriticalSectionsBuilder *this_02;
  
  this_00._M_head_impl = (GraphBuilder *)operator_new(0x1c8);
  GraphBuilder::GraphBuilder(this_00._M_head_impl,pointsToAnalysis);
  (this->graphBuilder)._M_t.super___uniq_ptr_impl<GraphBuilder,_std::default_delete<GraphBuilder>_>.
  _M_t.super__Tuple_impl<0UL,_GraphBuilder_*,_std::default_delete<GraphBuilder>_>.
  super__Head_base<0UL,_GraphBuilder_*,_false>._M_head_impl = this_00._M_head_impl;
  this_01 = (ThreadRegionsBuilder *)operator_new(0xa0);
  ThreadRegionsBuilder::ThreadRegionsBuilder(this_01,0);
  (this->threadRegionsBuilder)._M_t.
  super___uniq_ptr_impl<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_>._M_t.
  super__Tuple_impl<0UL,_ThreadRegionsBuilder_*,_std::default_delete<ThreadRegionsBuilder>_>.
  super__Head_base<0UL,_ThreadRegionsBuilder_*,_false>._M_head_impl = this_01;
  this_02 = (CriticalSectionsBuilder *)operator_new(0xf8);
  CriticalSectionsBuilder::CriticalSectionsBuilder(this_02);
  (this->criticalSectionsBuilder)._M_t.
  super___uniq_ptr_impl<CriticalSectionsBuilder,_std::default_delete<CriticalSectionsBuilder>_>._M_t
  .super__Tuple_impl<0UL,_CriticalSectionsBuilder_*,_std::default_delete<CriticalSectionsBuilder>_>.
  super__Head_base<0UL,_CriticalSectionsBuilder_*,_false>._M_head_impl = this_02;
  return;
}

Assistant:

ControlFlowGraph::ControlFlowGraph(dg::DGLLVMPointerAnalysis *pointsToAnalysis)
        : graphBuilder(new GraphBuilder(pointsToAnalysis)),
          threadRegionsBuilder(new ThreadRegionsBuilder()),
          criticalSectionsBuilder(new CriticalSectionsBuilder()) {}